

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *a,
              Matrix<double,_3,_3> *b)

{
  double dVar1;
  int row_1;
  long lVar2;
  Matrix<double,_3,_3> *res;
  double *pdVar3;
  int row;
  long lVar4;
  Vector<double,_3> *pVVar5;
  long lVar6;
  Vector<double,_3> *pVVar7;
  int ndx;
  double v;
  undefined8 uVar8;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined8 *)((long)pdVar3 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar4 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    pVVar5 = (Vector<double,_3> *)b;
    do {
      dVar1 = 0.0;
      lVar6 = 0;
      pVVar7 = (Vector<double,_3> *)a;
      do {
        dVar1 = dVar1 + ((Vector<tcu::Vector<double,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0] *
                        ((Vector<tcu::Vector<double,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data
                        [lVar6];
        lVar6 = lVar6 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar6 != 3);
      (__return_storage_ptr__->m_data).m_data[lVar4].m_data[lVar2] = dVar1;
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    a = (Matrix<double,_3,_3> *)(((Vector<double,_3> *)a)->m_data + 1);
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}